

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_prune.cpp
# Opt level: O0

void __thiscall
PruneReplayer::notify_application_info_link
          (PruneReplayer *this,Hash link_hash,Hash app_hash,ResourceTag tag,Hash hash)

{
  bool bVar1;
  Hash local_30;
  Hash hash_local;
  Hash HStack_20;
  ResourceTag tag_local;
  Hash app_hash_local;
  Hash link_hash_local;
  PruneReplayer *this_local;
  
  if (((this->skip_application_info_links & 1U) == 0) &&
     (local_30 = hash, hash_local._4_4_ = tag, HStack_20 = app_hash, app_hash_local = link_hash,
     link_hash_local = (Hash)this,
     bVar1 = filter_timestamp(this,RESOURCE_APPLICATION_BLOB_LINK,link_hash,(uint64_t *)0x0), bVar1)
     ) {
    if (((this->should_filter_application_hash & 1U) == 0) ||
       (HStack_20 != this->filter_application_hash)) {
      if ((this->should_filter_application_hash & 1U) == 0) {
        std::
        unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
        ::insert(this->filtered_blob_hashes + 8,&app_hash_local);
      }
    }
    else {
      std::
      unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
      ::insert(this->filtered_blob_hashes + hash_local._4_4_,&local_30);
      std::
      unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
      ::insert(this->filtered_blob_hashes + 8,&app_hash_local);
    }
  }
  return;
}

Assistant:

void notify_application_info_link(Hash link_hash, Hash app_hash, ResourceTag tag, Hash hash) override
	{
		if (skip_application_info_links)
			return;

		if (!filter_timestamp(RESOURCE_APPLICATION_BLOB_LINK, link_hash, nullptr))
			return;

		if (should_filter_application_hash && app_hash == filter_application_hash)
		{
			filtered_blob_hashes[tag].insert(hash);
			filtered_blob_hashes[RESOURCE_APPLICATION_BLOB_LINK].insert(link_hash);
		}
		else if (!should_filter_application_hash)
			filtered_blob_hashes[RESOURCE_APPLICATION_BLOB_LINK].insert(link_hash);
	}